

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  size_t i;
  long lVar5;
  array<unsigned_long,_26UL> histogram;
  long local_e8 [26];
  
  memset(local_e8,0,0xd0);
  sVar2 = 0;
  do {
    cVar1 = anon_var_dwarf_4bf[sVar2];
    iVar4 = -0x61;
    if (((byte)(cVar1 + 0x9fU) < 0x1a) || (iVar4 = -0x41, (byte)(cVar1 + 0xbfU) < 0x1a)) {
      local_e8[(uint)(iVar4 + cVar1)] = local_e8[(uint)(iVar4 + cVar1)] + 1;
    }
    sVar2 = sVar2 + 1;
  } while (sVar2 != 0x4f92e);
  puts("Characters in \'On Liberty\':");
  lVar5 = 0;
  do {
    printf("%c: %zu\n",(ulong)((int)lVar5 + 0x61),local_e8[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1a);
  lVar5 = 0;
  lVar3 = 0;
  do {
    lVar5 = lVar5 + *(long *)((long)local_e8 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0xd0);
  printf("other: %zu\n",0x4f92e - lVar5);
  return 0;
}

Assistant:

int main() {
  std::array<size_t, 26> histogram = {};
  size_t length = k_books_on_liberty_txt_len;
  for (size_t i = 0; i < length; ++i) {
    char c = k_books_on_liberty_txt[i];
    if ('a' <= c && c <= 'z') {
      histogram[c-'a']++;
    } else if ('A' <= c && c <= 'Z') {
      histogram[c-'A']++;
    }
  }
  printf("Characters in 'On Liberty':\n");
  for (size_t i = 0; i < 26; ++i) {
    printf("%c: %zu\n", char('a'+i), histogram[i]);
  }
  size_t count = std::accumulate(histogram.cbegin(), histogram.cend(), size_t());
  printf("other: %zu\n", length - count);
}